

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O1

void __thiscall
iqxmlrpc::http::Response_header::Response_header
          (Response_header *this,Verification_level lev,string *to_parse)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Malformed_packet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  ulong uVar6;
  i_interpreter_type i_interpreter;
  Token resp_line;
  string local_d8;
  int local_b4;
  string *local_b0;
  undefined1 local_a8 [32];
  _Elt_pointer local_88;
  _Map_pointer ppbStack_80;
  _Elt_pointer local_78;
  _Elt_pointer pbStack_70;
  _Elt_pointer local_68;
  _Map_pointer ppbStack_60;
  is_classifiedF local_50;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_40;
  
  Header::Header(&this->super_Header,lev);
  (this->super_Header)._vptr_Header = (_func_int **)&PTR__Response_header_00189c80;
  local_b0 = (string *)&this->phrase_;
  (this->phrase_)._M_dataplus._M_p = (pointer)&(this->phrase_).field_2;
  (this->phrase_)._M_string_length = 0;
  (this->phrase_).field_2._M_local_buf[0] = '\0';
  Header::parse(&this->super_Header,to_parse);
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"server","");
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"unknown","");
  Header::set_option_default(&this->super_Header,(string *)local_a8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_68 = (_Elt_pointer)0x0;
  ppbStack_60 = (_Map_pointer)0x0;
  local_78 = (_Elt_pointer)0x0;
  pbStack_70 = (_Elt_pointer)0x0;
  local_88 = (_Elt_pointer)0x0;
  ppbStack_80 = (_Map_pointer)0x0;
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a8,0);
  std::locale::locale((locale *)&local_d8);
  local_50.m_Type = 0x2000;
  std::locale::locale(&local_50.m_Locale,(locale *)&local_d8);
  boost::algorithm::
  split<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_classifiedF>
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8,&(this->super_Header).head_line_,&local_50,token_compress_on);
  std::locale::~locale(&local_50.m_Locale);
  std::locale::~locale((locale *)&local_d8);
  if (((long)local_88 - local_a8._16_8_ >> 5) + ((long)local_78 - (long)pbStack_70 >> 5) +
      ((((ulong)((long)ppbStack_60 - (long)ppbStack_80) >> 3) - 1) +
      (ulong)(ppbStack_60 == (_Map_pointer)0x0)) * 0x10 < 2) {
    this_00 = (Malformed_packet *)__cxa_allocate_exception(0x18);
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Bad response","");
    Malformed_packet::Malformed_packet(this_00,&local_d8);
    __cxa_throw(this_00,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar5 = (long)(local_a8._16_8_ - local_a8._24_8_) >> 5;
  uVar1 = lVar5 + 1;
  if (uVar1 < 0x10) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_a8._16_8_ + 0x20);
  }
  else {
    uVar6 = uVar1 >> 4 | 0xf000000000000000;
    if (-1 < lVar5) {
      uVar6 = uVar1 >> 4;
    }
    pbVar4 = ppbStack_80[uVar6] + uVar1 + uVar6 * -0x10;
  }
  local_b4 = 0;
  local_d8._M_string_length = (size_type)(pbVar4->_M_dataplus)._M_p;
  local_d8.field_2._M_allocated_capacity = local_d8._M_string_length + pbVar4->_M_string_length;
  local_40.start = (char *)local_d8._M_string_length;
  local_40.finish = (char *)local_d8.field_2._M_allocated_capacity;
  bVar3 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::shr_signed<int>
                    (&local_40,&local_b4);
  if (!bVar3) {
    local_d8._M_dataplus._M_p = (pointer)&PTR__bad_cast_0018a1e0;
    local_d8._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
    local_d8.field_2._M_allocated_capacity = (size_type)&int::typeinfo;
    boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_d8);
  }
  *(int *)&(this->super_Header).field_0x8c = local_b4;
  if (2 < ((long)local_88 - local_a8._16_8_ >> 5) + ((long)local_78 - (long)pbStack_70 >> 5) +
          ((((ulong)((long)ppbStack_60 - (long)ppbStack_80) >> 3) - 1) +
          (ulong)(ppbStack_60 == (_Map_pointer)0x0)) * 0x10) {
    std::__cxx11::string::_M_assign(local_b0);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a8);
  return;
}

Assistant:

Response_header::Response_header(Verification_level lev, const std::string& to_parse):
  Header(lev)
{
  parse(to_parse);
  set_option_default(names::server, "unknown");

  typedef std::deque<std::string> Token;
  Token resp_line;
  boost::split(resp_line, get_head_line(), boost::is_space(), boost::token_compress_on);

  if (resp_line.size() < 2) {
    throw Malformed_packet("Bad response");
  }

  try {
    code_ = boost::lexical_cast<int>(resp_line[1]);
  } catch (const boost::bad_lexical_cast&) {
    code_ = 0;
  }

  if (resp_line.size() > 2)
    phrase_ = resp_line[2];
}